

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printU5ImmOperand(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  ulong uVar2;
  uint8_t *puVar3;
  uint Value;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar2 = MCOperand_getImm(op);
  if ((uint)uVar2 < 10) {
    SStream_concat(O,"%u",uVar2 & 0xffffffff);
  }
  else {
    SStream_concat(O,"0x%x",uVar2 & 0xffffffff);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar3 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1a;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.addr_size * 0x10 + 0x1e) = (uint)uVar2;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
  }
  return;
}

Assistant:

static void printU5ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned int Value = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	//assert(Value <= 31 && "Invalid u5imm argument!");
	if (Value > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", Value);
	else
		SStream_concat(O, "%u", Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}